

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::TestinitiatorFixtureResendRequest_EndSeqNumberLargerThanMessages::
TestinitiatorFixtureResendRequest_EndSeqNumberLargerThanMessages
          (TestinitiatorFixtureResendRequest_EndSeqNumberLargerThanMessages *this)

{
  UnitTest::Test::Test
            (&this->super_Test,"ResendRequest_EndSeqNumberLargerThanMessages","SessionTests",
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/SessionTestCase.cpp"
             ,0x895);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00320690;
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, ResendRequest_EndSeqNumberLargerThanMessages) {
  startLoggedOn();

  object->setNextSenderMsgSeqNum(15);

  FIX::Message resendReq = createResendRequest( "ISLD", "TW", 2, 1, 20);
  object->next(resendReq, UtcTimeStamp());

  CHECK_EQUAL(15, object->getExpectedSenderNum());
  CHECK_EQUAL(3, object->getExpectedTargetNum());
}